

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawWallAddClamp1PalCommand::Execute
          (DrawWallAddClamp1PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  byte *pbVar16;
  
  iVar1 = *(int *)&(this->super_PalWall1Command).super_DrawerCommand.field_0xc;
  uVar2 = (this->super_PalWall1Command)._texturefrac;
  puVar5 = (this->super_PalWall1Command)._colormap;
  puVar6 = (this->super_PalWall1Command)._source;
  puVar7 = (this->super_PalWall1Command)._dest;
  iVar3 = (this->super_PalWall1Command)._fracbits;
  iVar4 = (this->super_PalWall1Command)._pitch;
  puVar8 = (this->super_PalWall1Command)._srcblend;
  puVar9 = (this->super_PalWall1Command)._destblend;
  iVar10 = DrawerThread::count_for_thread
                     (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y,
                      (this->super_PalWall1Command)._count);
  if (0 < iVar10) {
    iVar11 = DrawerThread::skipped_by_thread
                       (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y);
    pbVar16 = puVar7 + iVar11 * iVar4;
    iVar11 = DrawerThread::skipped_by_thread
                       (thread,(this->super_PalWall1Command).super_DrawerCommand._dest_y);
    uVar12 = iVar11 * iVar1 + uVar2;
    iVar11 = thread->num_cores;
    do {
      uVar14 = (ulong)puVar6[uVar12 >> ((byte)iVar3 & 0x3f)];
      if (uVar14 != 0) {
        uVar15 = puVar9[*pbVar16] + puVar8[puVar5[uVar14]];
        uVar13 = uVar15 & 0x40100400;
        uVar13 = uVar13 - (uVar13 >> 5) | uVar15 & 0x3e0f83e0 | 0x1f07c1f;
        *pbVar16 = RGB32k.All[uVar13 >> 0xf & uVar13];
      }
      uVar12 = uVar12 + iVar1 * iVar11;
      pbVar16 = pbVar16 + iVar11 * iVar4;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  return;
}

Assistant:

void DrawWallAddClamp1PalCommand::Execute(DrawerThread *thread)
	{
		uint32_t fracstep = _iscale;
		uint32_t frac = _texturefrac;
		uint8_t *colormap = _colormap;
		int count = _count;
		const uint8_t *source = _source;
		uint8_t *dest = _dest;
		int bits = _fracbits;
		int pitch = _pitch;

		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		do
		{
			uint8_t pix = source[frac >> bits];
			if (pix != 0)
			{
				uint32_t a = fg2rgb[colormap[pix]] + bg2rgb[*dest];
				uint32_t b = a;

				a |= 0x01f07c1f;
				b &= 0x40100400;
				a &= 0x3fffffff;
				b = b - (b >> 5);
				a |= b;
				*dest = RGB32k.All[a & (a >> 15)];
			}
			frac += fracstep;
			dest += pitch;
		} while (--count);
	}